

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_model.c
# Opt level: O1

void HTS_ModelSet_clear(HTS_ModelSet *ms)

{
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  
  if (ms->hts_voice_version != (char *)0x0) {
    free(ms->hts_voice_version);
  }
  if (ms->stream_type != (char *)0x0) {
    free(ms->stream_type);
  }
  if (ms->fullcontext_format != (char *)0x0) {
    free(ms->fullcontext_format);
  }
  if (ms->fullcontext_version != (char *)0x0) {
    free(ms->fullcontext_version);
  }
  if (ms->gv_off_context != (HTS_Question *)0x0) {
    HTS_Question_clear(ms->gv_off_context);
    free(ms->gv_off_context);
  }
  if (ms->option != (char **)0x0) {
    if (ms->num_streams != 0) {
      uVar2 = 0;
      do {
        if (ms->option[uVar2] != (char *)0x0) {
          free(ms->option[uVar2]);
        }
        uVar2 = uVar2 + 1;
      } while (uVar2 < ms->num_streams);
    }
    free(ms->option);
  }
  if (ms->duration != (HTS_Model *)0x0) {
    if (ms->num_voices != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        HTS_Model_clear((HTS_Model *)((long)&ms->duration->vector_length + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x40;
      } while (uVar2 < ms->num_voices);
    }
    free(ms->duration);
  }
  if (ms->window != (HTS_Window *)0x0) {
    if (ms->num_streams != 0) {
      lVar3 = 0;
      uVar2 = 0;
      do {
        HTS_Window_clear((HTS_Window *)((long)&ms->window->size + lVar3));
        uVar2 = uVar2 + 1;
        lVar3 = lVar3 + 0x28;
      } while (uVar2 < ms->num_streams);
    }
    free(ms->window);
  }
  if (ms->stream != (HTS_Model **)0x0) {
    if (ms->num_voices != 0) {
      uVar2 = 0;
      do {
        if (ms->num_streams != 0) {
          lVar3 = 0;
          uVar1 = 0;
          do {
            HTS_Model_clear((HTS_Model *)((long)&ms->stream[uVar2]->vector_length + lVar3));
            uVar1 = uVar1 + 1;
            lVar3 = lVar3 + 0x40;
          } while (uVar1 < ms->num_streams);
        }
        free(ms->stream[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 < ms->num_voices);
    }
    HTS_free(ms->stream);
  }
  if (ms->gv != (HTS_Model **)0x0) {
    if (ms->num_voices != 0) {
      uVar2 = 0;
      do {
        if (ms->num_streams != 0) {
          lVar3 = 0;
          uVar1 = 0;
          do {
            HTS_Model_clear((HTS_Model *)((long)&ms->gv[uVar2]->vector_length + lVar3));
            uVar1 = uVar1 + 1;
            lVar3 = lVar3 + 0x40;
          } while (uVar1 < ms->num_streams);
        }
        free(ms->gv[uVar2]);
        uVar2 = uVar2 + 1;
      } while (uVar2 < ms->num_voices);
    }
    free(ms->gv);
  }
  ms->window = (HTS_Window *)0x0;
  ms->stream = (HTS_Model **)0x0;
  ms->option = (char **)0x0;
  ms->duration = (HTS_Model *)0x0;
  ms->fullcontext_version = (char *)0x0;
  ms->gv_off_context = (HTS_Question *)0x0;
  ms->stream_type = (char *)0x0;
  ms->fullcontext_format = (char *)0x0;
  ms->num_states = 0;
  ms->num_streams = 0;
  ms->frame_period = 0;
  ms->num_voices = 0;
  ms->hts_voice_version = (char *)0x0;
  ms->sampling_frequency = 0;
  ms->gv = (HTS_Model **)0x0;
  return;
}

Assistant:

void HTS_ModelSet_clear(HTS_ModelSet * ms)
{
   size_t i, j;

   if (ms->hts_voice_version != NULL)
      free(ms->hts_voice_version);
   if (ms->stream_type != NULL)
      free(ms->stream_type);
   if (ms->fullcontext_format != NULL)
      free(ms->fullcontext_format);
   if (ms->fullcontext_version != NULL)
      free(ms->fullcontext_version);
   if (ms->gv_off_context != NULL) {
      HTS_Question_clear(ms->gv_off_context);
      free(ms->gv_off_context);
   }
   if (ms->option != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         if (ms->option[i] != NULL)
            free(ms->option[i]);
      free(ms->option);
   }

   if (ms->duration != NULL) {
      for (i = 0; i < ms->num_voices; i++)
         HTS_Model_clear(&ms->duration[i]);
      free(ms->duration);
   }
   if (ms->window != NULL) {
      for (i = 0; i < ms->num_streams; i++)
         HTS_Window_clear(&ms->window[i]);
      free(ms->window);
   }
   if (ms->stream != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->stream[i][j]);
         free(ms->stream[i]);
      }
      HTS_free(ms->stream);
   }
   if (ms->gv != NULL) {
      for (i = 0; i < ms->num_voices; i++) {
         for (j = 0; j < ms->num_streams; j++)
            HTS_Model_clear(&ms->gv[i][j]);
         free(ms->gv[i]);
      }
      free(ms->gv);
   }
   HTS_ModelSet_initialize(ms);
}